

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

size_t __thiscall
google::protobuf::(anonymous_namespace)::SymbolByParentHash::operator()
          (SymbolByParentHash *this,Symbol *s)

{
  size_t sVar1;
  pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_> local_20;
  
  Symbol::parent_name_key(&local_20,(Symbol *)this);
  sVar1 = absl::lts_20250127::
          HashOf<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    (&local_20);
  return sVar1;
}

Assistant:

size_t operator()(const T& s) const {
    return absl::HashOf(s.parent_name_key());
  }